

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cpp
# Opt level: O0

unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
__thiscall sf2cute::SoundFontWriter::MakeSdtaListChunk(SoundFontWriter *this)

{
  pointer this_00;
  SoundFont *this_01;
  SoundFontWriter *in_RSI;
  undefined1 local_30 [8];
  unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
  local_28;
  unique_ptr<sf2cute::RIFFListChunk,_std::default_delete<sf2cute::RIFFListChunk>_> local_20;
  unique_ptr<sf2cute::RIFFListChunk,_std::default_delete<sf2cute::RIFFListChunk>_> sdta;
  SoundFontWriter *this_local;
  
  std::make_unique<sf2cute::RIFFListChunk,char_const(&)[5]>((char (*) [5])&local_20);
  this_00 = std::unique_ptr<sf2cute::RIFFListChunk,_std::default_delete<sf2cute::RIFFListChunk>_>::
            operator->(&local_20);
  this_01 = file(in_RSI);
  SoundFont::samples(this_01);
  std::
  make_unique<sf2cute::SFRIFFSmplChunk,std::vector<std::shared_ptr<sf2cute::SFSample>,std::allocator<std::shared_ptr<sf2cute::SFSample>>>const&>
            ((vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
              *)local_30);
  std::unique_ptr<sf2cute::RIFFChunkInterface,std::default_delete<sf2cute::RIFFChunkInterface>>::
  unique_ptr<sf2cute::SFRIFFSmplChunk,std::default_delete<sf2cute::SFRIFFSmplChunk>,void>
            ((unique_ptr<sf2cute::RIFFChunkInterface,std::default_delete<sf2cute::RIFFChunkInterface>>
              *)&local_28,
             (unique_ptr<sf2cute::SFRIFFSmplChunk,_std::default_delete<sf2cute::SFRIFFSmplChunk>_> *
             )local_30);
  RIFFListChunk::AddSubchunk(this_00,&local_28);
  std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>::
  ~unique_ptr(&local_28);
  std::unique_ptr<sf2cute::SFRIFFSmplChunk,_std::default_delete<sf2cute::SFRIFFSmplChunk>_>::
  ~unique_ptr((unique_ptr<sf2cute::SFRIFFSmplChunk,_std::default_delete<sf2cute::SFRIFFSmplChunk>_>
               *)local_30);
  std::unique_ptr<sf2cute::RIFFChunkInterface,std::default_delete<sf2cute::RIFFChunkInterface>>::
  unique_ptr<sf2cute::RIFFListChunk,std::default_delete<sf2cute::RIFFListChunk>,void>
            ((unique_ptr<sf2cute::RIFFChunkInterface,std::default_delete<sf2cute::RIFFChunkInterface>>
              *)this,&local_20);
  std::unique_ptr<sf2cute::RIFFListChunk,_std::default_delete<sf2cute::RIFFListChunk>_>::~unique_ptr
            (&local_20);
  return (__uniq_ptr_data<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>,_true,_true>
          )(__uniq_ptr_data<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<RIFFChunkInterface> SoundFontWriter::MakeSdtaListChunk() {
  std::unique_ptr<RIFFListChunk> sdta = std::make_unique<RIFFListChunk>("sdta");
  sdta->AddSubchunk(std::make_unique<SFRIFFSmplChunk>(file().samples()));
  return std::move(sdta);
}